

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

ZSTD_CCtx_params * duckdb_zstd::ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters cParams)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  void *in_RDI;
  uint in_stack_00000008;
  uint in_stack_0000000c;
  uint in_stack_00000010;
  uint in_stack_00000014;
  uint in_stack_00000018;
  uint in_stack_0000001c;
  
  if (in_RDI == (void *)0x0) {
    uRam0000000000000004 = CONCAT44(in_stack_0000000c,in_stack_00000008);
    uRam0000000000000018 = CONCAT44(cParams.windowLog,in_stack_0000001c);
    uRam0000000000000014 = in_stack_00000018;
    uRam000000000000000c = in_stack_00000010;
    uRam0000000000000010 = in_stack_00000014;
    if (_DAT_00000060 == 0) goto LAB_0124911c;
    if (_DAT_00000060 != 1) goto LAB_01249168;
  }
  else {
    switchD_005681f0::default(in_RDI,0,0xd8);
    *(undefined4 *)((long)in_RDI + 0x2c) = 3;
    *(undefined4 *)((long)in_RDI + 0x20) = 1;
    *(ulong *)((long)in_RDI + 4) = CONCAT44(in_stack_0000000c,in_stack_00000008);
    *(ulong *)((long)in_RDI + 0xc) = CONCAT44(in_stack_00000014,in_stack_00000010);
    *(ulong *)((long)in_RDI + 0x10) = CONCAT44(in_stack_00000018,in_stack_00000014);
    *(ulong *)((long)in_RDI + 0x18) = CONCAT44(cParams.windowLog,in_stack_0000001c);
LAB_0124911c:
    if (((int)cParams.windowLog < 7) || (in_stack_00000008 < 0x1b)) {
      *(undefined4 *)((long)in_RDI + 0x60) = 2;
      goto LAB_01249168;
    }
    *(undefined4 *)((long)in_RDI + 0x60) = 1;
  }
  ZSTD_ldm_adjustParameters
            ((ldmParams_t *)((long)in_RDI + 0x60),(ZSTD_compressionParameters *)&stack0x00000008);
LAB_01249168:
  iVar2 = *(int *)((long)in_RDI + 0x8c);
  if ((iVar2 == 0) && (iVar2 = 2, 6 < (int)cParams.windowLog)) {
    iVar2 = (in_stack_00000008 < 0x11) + 1;
  }
  *(int *)((long)in_RDI + 0x8c) = iVar2;
  iVar2 = *(int *)((long)in_RDI + 0x90);
  if ((iVar2 == 0) && (iVar2 = 2, 0xfffffffc < cParams.windowLog - 6)) {
    iVar2 = (in_stack_00000008 < 0xf) + 1;
  }
  *(int *)((long)in_RDI + 0x90) = iVar2;
  lVar4 = 0x20000;
  if (*(long *)((long)in_RDI + 200) != 0) {
    lVar4 = *(long *)((long)in_RDI + 200);
  }
  *(long *)((long)in_RDI + 200) = lVar4;
  uVar1 = *(uint *)((long)in_RDI + 0xd0);
  uVar3 = (*(int *)((long)in_RDI + 0x2c) < 10) + 1;
  if (uVar1 != 0) {
    uVar3 = uVar1;
  }
  *(uint *)((long)in_RDI + 0xd0) = uVar3;
  return (ZSTD_CCtx_params *)(ulong)uVar1;
}

Assistant:

static ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(
        ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params cctxParams;
    /* should not matter, as all cParams are presumed properly defined */
    ZSTD_CCtxParams_init(&cctxParams, ZSTD_CLEVEL_DEFAULT);
    cctxParams.cParams = cParams;

    /* Adjust advanced params according to cParams */
    cctxParams.ldmParams.enableLdm = ZSTD_resolveEnableLdm(cctxParams.ldmParams.enableLdm, &cParams);
    if (cctxParams.ldmParams.enableLdm == ZSTD_ps_enable) {
        ZSTD_ldm_adjustParameters(&cctxParams.ldmParams, &cParams);
        assert(cctxParams.ldmParams.hashLog >= cctxParams.ldmParams.bucketSizeLog);
        assert(cctxParams.ldmParams.hashRateLog < 32);
    }
    cctxParams.useBlockSplitter = ZSTD_resolveBlockSplitterMode(cctxParams.useBlockSplitter, &cParams);
    cctxParams.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams.useRowMatchFinder, &cParams);
    cctxParams.validateSequences = ZSTD_resolveExternalSequenceValidation(cctxParams.validateSequences);
    cctxParams.maxBlockSize = ZSTD_resolveMaxBlockSize(cctxParams.maxBlockSize);
    cctxParams.searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(cctxParams.searchForExternalRepcodes,
                                                                             cctxParams.compressionLevel);
    assert(!ZSTD_checkCParams(cParams));
    return cctxParams;
}